

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nibbler.cpp
# Opt level: O0

bool __thiscall Nibbler::getInt(Nibbler *this,int *result)

{
  int iVar1;
  char *pcVar2;
  intmax_t iVar3;
  bool bVar4;
  string local_48 [32];
  ulong local_28;
  size_type i;
  int *result_local;
  Nibbler *this_local;
  
  local_28 = this->_cursor;
  i = (size_type)result;
  result_local = (int *)this;
  if (local_28 < this->_length) {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)this);
    if (*pcVar2 == '-') {
      local_28 = local_28 + 1;
    }
    else {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)this);
      if (*pcVar2 == '+') {
        local_28 = local_28 + 1;
      }
    }
  }
  while( true ) {
    bVar4 = false;
    if (local_28 < this->_length) {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)this);
      iVar1 = isdigit((int)*pcVar2);
      bVar4 = iVar1 != 0;
    }
    if (!bVar4) break;
    local_28 = local_28 + 1;
  }
  bVar4 = this->_cursor < local_28;
  if (bVar4) {
    std::__cxx11::string::substr((ulong)local_48,(ulong)this);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iVar3 = strtoimax(pcVar2,(char **)0x0,10);
    *(int *)i = (int)iVar3;
    std::__cxx11::string::~string(local_48);
    this->_cursor = local_28;
  }
  return bVar4;
}

Assistant:

bool Nibbler::getInt (int& result)
{
  std::string::size_type i = _cursor;

  if (i < _length)
  {
    if (_input[i] == '-')
      ++i;
    else if (_input[i] == '+')
      ++i;
  }

  // TODO Potential for use of find_first_not_of
  while (i < _length && isdigit (_input[i]))
    ++i;

  if (i > _cursor)
  {
    result = strtoimax (_input.substr (_cursor, i - _cursor).c_str (), NULL, 10);
    _cursor = i;
    return true;
  }

  return false;
}